

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_string.c
# Opt level: O3

void d_string_append_c(DString *baseString,char appendedCharacter)

{
  unsigned_long uVar1;
  
  if (appendedCharacter != '\0' && baseString != (DString *)0x0) {
    ensureStringBufferCanHold(baseString,baseString->currentStringLength + 1);
    baseString->str[baseString->currentStringLength] = appendedCharacter;
    uVar1 = baseString->currentStringLength;
    baseString->currentStringLength = uVar1 + 1;
    baseString->str[uVar1 + 1] = '\0';
  }
  return;
}

Assistant:

void d_string_append_c(DString * baseString, char appendedCharacter) {
	if (baseString && appendedCharacter) {
		size_t newSizeNeeded = baseString->currentStringLength + 1;
		ensureStringBufferCanHold(baseString, newSizeNeeded);

		baseString->str[baseString->currentStringLength] = appendedCharacter;
		baseString->currentStringLength++;
		baseString->str[baseString->currentStringLength] = '\0';
	}
}